

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  Allocator *pAVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  uint uVar11;
  void *pvVar12;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  void *pvVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined4 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar34;
  undefined1 auVar33 [16];
  undefined1 local_168 [16];
  ulong local_158;
  Allocator *pAStack_150;
  undefined1 local_148 [16];
  ulong local_138;
  allocator_type local_129;
  void *local_128;
  int remain;
  long local_118;
  void *local_110;
  long local_108;
  Mat *local_100;
  ulong local_f8;
  ulong local_f0;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  ulong local_c8;
  void *local_c0;
  ulong local_b8;
  int local_b0;
  int local_ac;
  Mat *local_a8;
  Option *local_a0;
  ulong local_98;
  void *local_90;
  long local_88;
  long local_80;
  long local_78;
  void *local_70;
  void *local_68;
  ulong local_60;
  long local_58;
  int remain_1;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar11 = bottom_blob->c;
  if ((int)uVar11 % this->group != 0) {
    return -100;
  }
  iVar20 = this->num_output;
  if (iVar20 % this->group != 0) {
    return -100;
  }
  local_118 = (long)bottom_blob->w;
  local_f8 = (ulong)(uint)bottom_blob->h;
  uVar25 = bottom_blob->elemsize;
  iVar17 = (bottom_blob->w + -1) * this->stride_w + (this->kernel_w + -1) * this->dilation_w + 1;
  iVar26 = (this->kernel_h + -1) * this->dilation_h + (bottom_blob->h - 1U) * this->stride_h + 1;
  local_148 = (undefined1  [16])0x0;
  local_158 = 0;
  pAStack_150 = (Allocator *)0x0;
  local_168 = (undefined1  [16])0x0;
  local_138 = 0;
  local_100 = bottom_blob;
  local_a0 = opt;
  if ((this->pad_w < 1) && (this->pad_h < 1)) {
    if ((Mat *)local_168 == top_blob) {
      bVar28 = true;
      piVar15 = (int *)0x0;
      iVar10 = 0;
      iVar9 = 0;
      iVar34 = 0;
      bVar27 = false;
    }
    else {
      piVar15 = top_blob->refcount;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      piVar15 = top_blob->refcount;
      local_168._0_8_ = top_blob->data;
      local_168._8_8_ = top_blob->refcount;
      local_158 = top_blob->elemsize;
      pAStack_150 = top_blob->allocator;
      iVar34 = top_blob->w;
      iVar9 = top_blob->h;
      iVar10 = top_blob->c;
      local_148._0_4_ = top_blob->dims;
      local_148._4_4_ = top_blob->w;
      local_148._8_4_ = top_blob->h;
      local_148._12_4_ = top_blob->c;
      local_138 = top_blob->cstep;
      iVar20 = this->num_output;
      bVar27 = top_blob->dims == 3;
      bVar28 = top_blob->data == (void *)0x0;
    }
    pAVar2 = opt->blob_allocator;
    if ((bool)(local_158 == uVar25 &
               (iVar10 == iVar20 && iVar9 == iVar26) & iVar34 == iVar17 & bVar27 &
              pAStack_150 == pAVar2)) {
      iVar20 = -100;
      uVar21 = local_138;
      if (!bVar28) goto LAB_0012ed86;
    }
    else {
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (pAStack_150 == (Allocator *)0x0) {
            if ((void *)local_168._0_8_ != (void *)0x0) {
              free(*(void **)(local_168._0_8_ + -8));
            }
          }
          else {
            (**(code **)(*(long *)pAStack_150 + 8))();
          }
        }
      }
      local_168 = (undefined1  [16])0x0;
      local_148._4_4_ = iVar17;
      local_148._0_4_ = 3;
      local_148._8_4_ = iVar26;
      local_148._12_4_ = iVar20;
      uVar19 = (long)(iVar26 * iVar17) * uVar25 + 0xf & 0xfffffffffffffff0;
      uVar21 = uVar19 / uVar25;
      if ((long)iVar20 * uVar21 == 0) {
        return -100;
      }
      uVar13 = (long)iVar20 * uVar21 * uVar25 + 3 & 0xfffffffffffffffc;
      local_138 = uVar21;
      pAStack_150 = pAVar2;
      if (pAVar2 == (Allocator *)0x0) {
        local_158 = uVar25;
        pvVar12 = malloc(uVar13 + 0x1c);
        local_168._0_8_ = (long)pvVar12 + 0x17U & 0xfffffffffffffff0;
        *(void **)(local_168._0_8_ - 8) = pvVar12;
      }
      else {
        local_158 = uVar25;
        local_168._0_8_ = (*(code *)**(undefined8 **)pAVar2)(pAVar2,uVar13 + 4,uVar19 % uVar25);
        uVar21 = local_138;
      }
      piVar15 = (int *)(local_168._0_8_ + uVar13);
      local_168._8_8_ = piVar15;
      *(undefined4 *)(local_168._0_8_ + uVar13) = 1;
      iVar10 = local_148._12_4_;
LAB_0012ed86:
      if ((long)iVar10 * uVar21 != 0) goto LAB_0012ed9a;
      iVar20 = -100;
    }
  }
  else {
    pAStack_150 = opt->workspace_allocator;
    local_168 = (undefined1  [16])0x0;
    local_148._4_4_ = iVar17;
    local_148._0_4_ = 3;
    local_148._8_4_ = iVar26;
    local_148._12_4_ = iVar20;
    uVar19 = (long)(iVar26 * iVar17) * uVar25 + 0xf & 0xfffffffffffffff0;
    uVar21 = uVar19 / uVar25;
    if ((long)iVar20 * uVar21 == 0) {
      return -100;
    }
    uVar13 = (long)iVar20 * uVar21 * uVar25 + 3 & 0xfffffffffffffffc;
    local_138 = uVar21;
    if (pAStack_150 == (Allocator *)0x0) {
      local_158 = uVar25;
      pvVar12 = malloc(uVar13 + 0x1c);
      local_168._0_8_ = (long)pvVar12 + 0x17U & 0xfffffffffffffff0;
      *(void **)(local_168._0_8_ - 8) = pvVar12;
    }
    else {
      local_158 = uVar25;
      local_168._0_8_ =
           (*(code *)**(undefined8 **)pAStack_150)(pAStack_150,uVar13 + 4,uVar19 % uVar25);
      uVar21 = local_138;
    }
    piVar15 = (int *)(local_168._0_8_ + uVar13);
    local_168._8_8_ = piVar15;
    *(undefined4 *)(local_168._0_8_ + uVar13) = 1;
    if ((long)(int)local_148._12_4_ * uVar21 == 0) {
      iVar20 = -100;
      goto LAB_0012f638;
    }
LAB_0012ed9a:
    uVar25 = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar25,&local_129);
    iVar20 = this->kernel_h;
    if (0 < iVar20) {
      iVar26 = this->dilation_h;
      iVar34 = this->kernel_w;
      iVar9 = this->dilation_w * iVar34;
      iVar10 = 0;
      iVar14 = 0;
      iVar18 = 0;
      do {
        if (0 < iVar34) {
          lVar23 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar10 + lVar23] = iVar14;
            iVar14 = iVar14 + this->dilation_w;
            iVar34 = this->kernel_w;
            lVar23 = lVar23 + 1;
          } while ((int)lVar23 < iVar34);
          iVar10 = iVar10 + (int)lVar23;
          iVar20 = this->kernel_h;
        }
        iVar14 = iVar14 + (iVar17 * iVar26 - iVar9);
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar20);
    }
    auVar8 = _DAT_0013a4c0;
    auVar7 = _DAT_0013a4b0;
    auVar6 = _DAT_0013a440;
    uVar22 = this->group;
    iVar20 = (int)uVar25;
    if (uVar22 == this->num_output && uVar11 == uVar22) {
      if (0 < (int)uVar11) {
        local_d0 = local_100->data;
        local_d8 = (void *)(local_100->cstep * local_100->elemsize);
        pvVar12 = (this->weight_data).data;
        local_128 = (void *)(local_138 * local_158);
        local_108 = CONCAT44(local_108._4_4_,local_148._4_4_);
        uVar22 = local_148._8_4_ * local_148._4_4_;
        _remain = (ulong)uVar22;
        iVar17 = this->bias_term;
        local_c0 = (void *)CONCAT44(local_c0._4_4_,iVar17);
        local_e0 = (this->bias_data).data;
        local_c8 = (ulong)(uVar22 + 3 & 0xfffffffc);
        lVar23 = _remain - 1;
        auVar29._8_4_ = (int)lVar23;
        auVar29._0_8_ = lVar23;
        auVar29._12_4_ = (int)((ulong)lVar23 >> 0x20);
        local_110 = (void *)local_168._0_8_;
        lVar23 = local_168._0_8_ + 0xc;
        local_100 = (Mat *)(uVar25 * 4);
        uVar21 = 0;
        auVar29 = auVar29 ^ _DAT_0013a440;
        do {
          if (iVar17 == 0) {
            uVar30 = 0;
          }
          else {
            uVar30 = *(undefined4 *)((long)local_e0 + uVar21 * 4);
          }
          if (0 < (int)uVar22) {
            uVar19 = 0;
            do {
              auVar31._8_4_ = (int)uVar19;
              auVar31._0_8_ = uVar19;
              auVar31._12_4_ = (int)(uVar19 >> 0x20);
              auVar33 = (auVar31 | auVar8) ^ auVar6;
              iVar26 = auVar29._4_4_;
              if ((bool)(~(iVar26 < auVar33._4_4_ ||
                          auVar29._0_4_ < auVar33._0_4_ && auVar33._4_4_ == iVar26) & 1)) {
                *(undefined4 *)(lVar23 + -0xc + uVar19 * 4) = uVar30;
              }
              if (auVar33._12_4_ <= auVar29._12_4_ &&
                  (auVar33._8_4_ <= auVar29._8_4_ || auVar33._12_4_ != auVar29._12_4_)) {
                *(undefined4 *)(lVar23 + -8 + uVar19 * 4) = uVar30;
              }
              auVar33 = (auVar31 | auVar7) ^ auVar6;
              iVar34 = auVar33._4_4_;
              if (iVar34 <= iVar26 && (iVar34 != iVar26 || auVar33._0_4_ <= auVar29._0_4_)) {
                *(undefined4 *)(lVar23 + -4 + uVar19 * 4) = uVar30;
                *(undefined4 *)(lVar23 + uVar19 * 4) = uVar30;
              }
              uVar19 = uVar19 + 4;
            } while (local_c8 != uVar19);
          }
          if (0 < (int)local_f8) {
            iVar26 = this->stride_h;
            iVar34 = this->stride_w;
            uVar19 = 0;
            do {
              if (0 < (int)local_118) {
                lVar24 = 0;
                do {
                  if (0 < iVar20) {
                    lVar5 = lVar24 * iVar34 * 4 +
                            (long)(iVar26 * local_148._4_4_ * (int)uVar19) * 4 +
                            (long)local_128 * uVar21;
                    uVar13 = 0;
                    do {
                      *(float *)(local_168._0_8_ +
                                (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[uVar13] * 4 + lVar5)
                           = *(float *)((long)pvVar12 + uVar13 * 4) *
                             *(float *)((long)local_d0 +
                                       lVar24 * 4 + uVar19 * local_118 * 4 + (long)local_d8 * uVar21
                                       ) +
                             *(float *)(local_168._0_8_ +
                                       (long)_space_ofs.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[uVar13] * 4 + lVar5);
                      uVar13 = uVar13 + 1;
                    } while ((uVar25 & 0xffffffff) != uVar13);
                  }
                  lVar24 = lVar24 + 1;
                } while (lVar24 != local_118);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != local_f8);
          }
          uVar21 = uVar21 + 1;
          lVar23 = lVar23 + (long)local_128;
          pvVar12 = (void *)((long)&local_100->data + (long)pvVar12);
          local_b8 = (ulong)uVar11;
        } while (uVar21 != uVar11);
      }
    }
    else {
      local_98 = (ulong)uVar22;
      uVar11 = (int)uVar11 / (int)uVar22;
      if (0 < (int)uVar22) {
        uVar21 = (long)this->num_output / (long)(int)uVar22;
        local_110 = (void *)(uVar21 & 0xffffffff);
        local_90 = (this->weight_data).data;
        local_108 = local_138 * local_158;
        local_b0 = local_148._4_4_;
        uVar22 = local_148._8_4_ * local_148._4_4_;
        _remain_1 = (ulong)uVar22;
        local_ac = this->bias_term;
        iVar17 = (int)uVar21;
        local_88 = (long)iVar17;
        local_60 = (ulong)(uVar22 + 3 & 0xfffffffc);
        lVar23 = _remain_1 - 1;
        auVar33._8_4_ = (int)lVar23;
        auVar33._0_8_ = lVar23;
        auVar33._12_4_ = (int)((ulong)lVar23 >> 0x20);
        local_80 = local_108 * local_88;
        local_78 = (long)(int)(uVar11 * iVar20 * iVar17) * 4;
        local_58 = (long)(int)(uVar11 * iVar20) * 4;
        auVar33 = auVar33 ^ _DAT_0013a440;
        local_70 = (void *)local_168._0_8_;
        local_e8 = (void *)(local_168._0_8_ + 0xc);
        local_f0 = 0;
        do {
          if (0 < iVar17) {
            local_e0 = (void *)(local_f0 * local_88);
            local_68 = (this->bias_data).data;
            local_128 = local_90;
            pvVar12 = local_e8;
            pvVar16 = (void *)0x0;
            do {
              local_d8 = pvVar16;
              local_d0 = pvVar12;
              if (local_ac == 0) {
                uVar30 = 0;
              }
              else {
                uVar30 = *(undefined4 *)((long)local_68 + ((long)local_d8 + (long)local_e0) * 4);
              }
              if (0 < (int)uVar22) {
                uVar21 = 0;
                do {
                  auVar32._8_4_ = (int)uVar21;
                  auVar32._0_8_ = uVar21;
                  auVar32._12_4_ = (int)(uVar21 >> 0x20);
                  auVar29 = (auVar32 | auVar8) ^ auVar6;
                  iVar26 = auVar33._4_4_;
                  if ((bool)(~(iVar26 < auVar29._4_4_ ||
                              auVar33._0_4_ < auVar29._0_4_ && auVar29._4_4_ == iVar26) & 1)) {
                    *(undefined4 *)((long)local_d0 + uVar21 * 4 + -0xc) = uVar30;
                  }
                  if (auVar29._12_4_ <= auVar33._12_4_ &&
                      (auVar29._8_4_ <= auVar33._8_4_ || auVar29._12_4_ != auVar33._12_4_)) {
                    *(undefined4 *)((long)local_d0 + uVar21 * 4 + -8) = uVar30;
                  }
                  auVar32 = (auVar32 | auVar7) ^ auVar6;
                  iVar34 = auVar32._4_4_;
                  if (iVar34 <= iVar26 && (iVar34 != iVar26 || auVar32._0_4_ <= auVar33._0_4_)) {
                    *(undefined4 *)((long)local_d0 + uVar21 * 4 + -4) = uVar30;
                    *(undefined4 *)((long)local_d0 + uVar21 * 4) = uVar30;
                  }
                  uVar21 = uVar21 + 4;
                } while (local_60 != uVar21);
              }
              if (0 < (int)local_f8) {
                local_c0 = (void *)((long)((long)local_d8 + (long)local_e0) * local_108 +
                                   local_168._0_8_);
                iVar26 = this->stride_h * local_148._4_4_;
                local_c8 = CONCAT44(local_c8._4_4_,iVar26);
                local_b8 = (ulong)this->stride_w;
                _remain = 0;
                do {
                  if (0 < (int)local_118) {
                    iVar34 = local_100->w;
                    sVar3 = local_100->cstep;
                    sVar4 = local_100->elemsize;
                    pvVar12 = local_100->data;
                    lVar23 = 0;
                    do {
                      if (0 < (int)uVar11) {
                        lVar24 = lVar23 * local_b8 * 4 + (long)(iVar26 * (int)_remain) * 4;
                        uVar21 = 0;
                        pvVar16 = local_128;
                        do {
                          if (0 < iVar20) {
                            fVar1 = *(float *)((long)pvVar12 +
                                              (uVar21 + uVar11 * (int)local_f0) * sVar3 * sVar4 +
                                              lVar23 * 4 + (long)iVar34 * _remain * 4);
                            uVar19 = 0;
                            do {
                              *(float *)((long)local_c0 +
                                        (long)_space_ofs.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar19] * 4 + lVar24)
                                   = *(float *)((long)pvVar16 + uVar19 * 4) * fVar1 +
                                     *(float *)((long)local_c0 +
                                               (long)_space_ofs.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start
                                                     [uVar19] * 4 + lVar24);
                              uVar19 = uVar19 + 1;
                            } while ((uVar25 & 0xffffffff) != uVar19);
                          }
                          uVar21 = uVar21 + 1;
                          pvVar16 = (void *)((long)pvVar16 + uVar25 * 4);
                        } while (uVar21 != uVar11);
                      }
                      lVar23 = lVar23 + 1;
                    } while (lVar23 != local_118);
                  }
                  _remain = _remain + 1;
                } while (_remain != local_f8);
              }
              local_128 = (void *)((long)local_128 + local_58);
              pvVar12 = (void *)((long)local_d0 + local_108);
              pvVar16 = (void *)((long)local_d8 + 1U);
            } while ((void *)((long)local_d8 + 1U) != local_110);
          }
          local_f0 = local_f0 + 1;
          local_e8 = (void *)((long)local_e8 + local_80);
          local_90 = (void *)((long)local_90 + local_78);
        } while (local_f0 != local_98);
      }
    }
    iVar20 = this->pad_w;
    iVar17 = this->pad_h;
    local_a8 = top_blob;
    if (iVar17 < 1 && iVar20 < 1) {
      Mat::operator=(top_blob,(Mat *)local_168);
LAB_0012f602:
      iVar20 = 0;
    }
    else {
      copy_cut_border((Mat *)local_168,top_blob,iVar17,iVar17,iVar20,iVar20,local_a0->blob_allocator
                      ,local_a0->num_threads);
      iVar20 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
      goto LAB_0012f602;
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar15 = (int *)local_168._8_8_;
  }
  if (piVar15 == (int *)0x0) {
    return iVar20;
  }
LAB_0012f638:
  LOCK();
  *piVar15 = *piVar15 + -1;
  UNLOCK();
  if (*piVar15 == 0) {
    if (pAStack_150 == (Allocator *)0x0) {
      if ((void *)local_168._0_8_ != (void *)0x0) {
        free(*(void **)(local_168._0_8_ + -8));
      }
    }
    else {
      (**(code **)(*(long *)pAStack_150 + 8))();
    }
  }
  return iVar20;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_w > 0 || pad_h > 0)
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i*w + j];
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i*stride_h) + j*stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[ space_ofs[k] ] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }
            }
        }
    }

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w, opt.blob_allocator, opt.num_threads);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}